

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::pp_include(CTcTokenizer *this)

{
  int iVar1;
  wchar_t wVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  CTcTokenizer *this_00;
  CTcTokStream *this_01;
  byte *in_RDI;
  bool bVar7;
  tctok_incpath_t *inc_path;
  char pathbuf [4096];
  CTcTokStream *cur_str;
  utf8_ptr closep;
  utf8_ptr start;
  int expand;
  CTcTokFileDesc *desc;
  int found;
  char lcl_name [4096];
  char full_name [4096];
  int default_charset_error;
  int charset_error;
  CTcSrcFile *new_src;
  utf8_ptr fname;
  int is_absolute;
  int is_local;
  wchar_t match;
  char *in_stack_ffffffffffffcf08;
  CTcTokenizer *in_stack_ffffffffffffcf10;
  CTcTokenizer *in_stack_ffffffffffffcf18;
  CTcTokenizer *pCVar8;
  CTcTokenizer *in_stack_ffffffffffffcf20;
  CTcTokenizer *in_stack_ffffffffffffcf28;
  undefined4 in_stack_ffffffffffffcf30;
  undefined4 in_stack_ffffffffffffcf34;
  CTcTokString *in_stack_ffffffffffffcf38;
  CTcTokenizer *in_stack_ffffffffffffcf40;
  char *in_stack_ffffffffffffcf48;
  CTcTokenizer *in_stack_ffffffffffffcf50;
  char *in_stack_ffffffffffffcf58;
  char *in_stack_ffffffffffffcf60;
  CTcTokenizer *this_02;
  undefined8 *local_3070;
  char local_3068 [48];
  int *in_stack_ffffffffffffd138;
  int *in_stack_ffffffffffffd140;
  char *in_stack_ffffffffffffd148;
  CResLoader *in_stack_ffffffffffffd150;
  char *in_stack_ffffffffffffd158;
  CTcTokStream *local_2068;
  utf8_ptr local_2058;
  int local_204c;
  CTcTokFileDesc *local_2048;
  uint local_203c;
  CTcTokenizer local_2038;
  CTcTokenizer local_1038;
  int local_30;
  int local_2c;
  CTcSrcFile *local_28;
  utf8_ptr local_20;
  int local_14;
  int local_10;
  wchar_t local_c;
  
  utf8_ptr::utf8_ptr(&local_20);
  utf8_ptr::utf8_ptr(&local_2058);
  local_204c = 1;
  local_2058.p_ = *(char **)(in_RDI + 0x90);
  while( true ) {
    utf8_ptr::getch((utf8_ptr *)0x2e8196);
    iVar1 = is_space(L'\0');
    if (iVar1 == 0) break;
    utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffcf10);
  }
  wVar2 = utf8_ptr::getch((utf8_ptr *)0x2e81c8);
  if (wVar2 == L'\"') {
    local_c = L'\"';
  }
  else {
    if (wVar2 != L'<') goto LAB_002e82e9;
    local_c = L'>';
  }
  utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffcf10);
  while( true ) {
    wVar2 = utf8_ptr::getch((utf8_ptr *)0x2e821e);
    bVar7 = false;
    if (wVar2 != L'\0') {
      wVar2 = utf8_ptr::getch((utf8_ptr *)0x2e823c);
      bVar7 = wVar2 != local_c;
    }
    if (!bVar7) break;
    utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffcf10);
  }
  wVar2 = utf8_ptr::getch((utf8_ptr *)0x2e827a);
  if (wVar2 == local_c) {
    utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffcf10);
    while( true ) {
      utf8_ptr::getch((utf8_ptr *)0x2e82a5);
      iVar1 = is_space(L'\0');
      if (iVar1 == 0) break;
      utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffcf10);
    }
    wVar2 = utf8_ptr::getch((utf8_ptr *)0x2e82d5);
    if (wVar2 == L'\0') {
      local_204c = 0;
    }
  }
LAB_002e82e9:
  *(char **)(in_RDI + 0x90) = local_2058.p_;
  if (local_204c != 0) {
    iVar1 = expand_macros_curline
                      (in_stack_ffffffffffffcf28,(int)((ulong)in_stack_ffffffffffffcf20 >> 0x20),
                       (int)in_stack_ffffffffffffcf20,
                       (int)((ulong)in_stack_ffffffffffffcf18 >> 0x20));
    if (iVar1 != 0) {
      clear_linebuf(in_stack_ffffffffffffcf10);
      return;
    }
    remove_expansion_flags(in_stack_ffffffffffffcf40,in_stack_ffffffffffffcf38);
    start_new_line(in_stack_ffffffffffffcf20,(CTcTokString *)in_stack_ffffffffffffcf18,
                   (int)((ulong)in_stack_ffffffffffffcf10 >> 0x20));
  }
  while( true ) {
    utf8_ptr::getch((utf8_ptr *)0x2e8368);
    iVar1 = is_space(L'\0');
    if (iVar1 == 0) break;
    utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffcf10);
  }
  wVar2 = utf8_ptr::getch((utf8_ptr *)0x2e839a);
  if (wVar2 == L'\"') {
    local_c = L'\"';
    local_10 = 1;
  }
  else {
    wVar2 = utf8_ptr::getch((utf8_ptr *)0x2e83c8);
    if (wVar2 != L'<') {
      log_error(0x2715);
      clear_linebuf(in_stack_ffffffffffffcf10);
      return;
    }
    local_c = L'>';
    local_10 = 0;
  }
  utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffcf10);
  local_20.p_ = *(char **)(in_RDI + 0x90);
  while( true ) {
    wVar2 = utf8_ptr::getch((utf8_ptr *)0x2e8438);
    bVar7 = false;
    if (wVar2 != L'\0') {
      wVar2 = utf8_ptr::getch((utf8_ptr *)0x2e8456);
      bVar7 = wVar2 != local_c;
    }
    if (!bVar7) break;
    utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffcf10);
  }
  wVar2 = utf8_ptr::getch((utf8_ptr *)0x2e8494);
  if (wVar2 == L'\0') {
    log_error(0x2715);
    clear_linebuf(in_stack_ffffffffffffcf10);
  }
  else {
    utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffcf10);
    while( true ) {
      utf8_ptr::getch((utf8_ptr *)0x2e84e5);
      iVar1 = is_space(L'\0');
      if (iVar1 == 0) break;
      utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffcf10);
    }
    wVar2 = utf8_ptr::getch((utf8_ptr *)0x2e8517);
    if (wVar2 != L'\0') {
      log_warning(0x274c);
    }
    utf8_ptr::setch((utf8_ptr *)in_stack_ffffffffffffcf10,
                    (wchar_t)((ulong)in_stack_ffffffffffffcf08 >> 0x20));
    utf8_ptr::getptr(&local_20);
    local_14 = os_is_file_absolute(in_stack_ffffffffffffcf08);
    local_203c = 0;
    this_02 = &local_2038;
    pcVar5 = utf8_ptr::getptr(&local_20);
    os_cvt_url_dir((char *)this_02,0x1000,pcVar5);
    if ((local_10 != 0) && (*(long *)(in_RDI + 0x38) != 0)) {
      for (local_2068 = *(CTcTokStream **)(in_RDI + 0x58); local_2068 != (CTcTokStream *)0x0;
          local_2068 = CTcTokStream::get_parent(local_2068)) {
        in_stack_ffffffffffffcf60 = local_3068;
        CTcTokFileDesc::get_fname(*(CTcTokFileDesc **)(in_RDI + 0x38));
        os_get_path_name((char *)in_stack_ffffffffffffcf40,(size_t)in_stack_ffffffffffffcf38,
                         (char *)CONCAT44(in_stack_ffffffffffffcf34,in_stack_ffffffffffffcf30));
        os_build_full_path((char *)in_stack_ffffffffffffcf20,(size_t)in_stack_ffffffffffffcf18,
                           (char *)in_stack_ffffffffffffcf10,in_stack_ffffffffffffcf08);
        iVar1 = access((char *)&local_1038,0);
        if (iVar1 == 0) {
          local_203c = 1;
          break;
        }
        if (local_14 == 0) {
          in_stack_ffffffffffffcf50 = &local_1038;
          in_stack_ffffffffffffcf58 = local_3068;
          utf8_ptr::getptr(&local_20);
          os_build_full_path((char *)in_stack_ffffffffffffcf20,(size_t)in_stack_ffffffffffffcf18,
                             (char *)in_stack_ffffffffffffcf10,in_stack_ffffffffffffcf08);
          iVar1 = access((char *)&local_1038,0);
          if (iVar1 == 0) {
            local_203c = 1;
            break;
          }
        }
      }
    }
    iVar1 = (int)((ulong)in_stack_ffffffffffffcf50 >> 0x20);
    if (local_203c == 0) {
      for (local_3070 = *(undefined8 **)(in_RDI + 0x28);
          iVar1 = (int)((ulong)in_stack_ffffffffffffcf50 >> 0x20), local_3070 != (undefined8 *)0x0;
          local_3070 = (undefined8 *)*local_3070) {
        os_build_full_path((char *)in_stack_ffffffffffffcf20,(size_t)in_stack_ffffffffffffcf18,
                           (char *)in_stack_ffffffffffffcf10,in_stack_ffffffffffffcf08);
        iVar3 = access((char *)&local_1038,0);
        iVar1 = (int)((ulong)in_stack_ffffffffffffcf50 >> 0x20);
        if (iVar3 == 0) {
          local_203c = 1;
          break;
        }
        if (local_14 == 0) {
          in_stack_ffffffffffffcf40 = &local_1038;
          in_stack_ffffffffffffcf48 = (char *)(local_3070 + 1);
          utf8_ptr::getptr(&local_20);
          os_build_full_path((char *)in_stack_ffffffffffffcf20,(size_t)in_stack_ffffffffffffcf18,
                             (char *)in_stack_ffffffffffffcf10,in_stack_ffffffffffffcf08);
          iVar3 = access((char *)&local_1038,0);
          iVar1 = (int)((ulong)in_stack_ffffffffffffcf50 >> 0x20);
          if (iVar3 == 0) {
            local_203c = 1;
            break;
          }
        }
      }
    }
    if ((local_14 != 0) && (local_203c == 0)) {
      pCVar8 = &local_1038;
      pcVar5 = utf8_ptr::getptr(&local_20);
      strcpy((char *)pCVar8,pcVar5);
      iVar3 = access((char *)&local_1038,0);
      local_203c = (uint)((iVar3 != 0 ^ 0xffU) & 1);
    }
    clear_linebuf(in_stack_ffffffffffffcf10);
    if (local_203c == 0) {
      pcVar5 = utf8_ptr::getptr(&local_20);
      sVar6 = strlen(pcVar5);
      uVar4 = (uint)sVar6;
      pcVar5 = utf8_ptr::getptr(&local_20);
      log_error(0x2716,(ulong)uVar4,pcVar5);
    }
    else {
      iVar3 = find_include_once(in_stack_ffffffffffffcf18,(char *)in_stack_ffffffffffffcf10);
      if (iVar3 == 0) {
        local_28 = CTcSrcFile::open_source
                             (in_stack_ffffffffffffd158,in_stack_ffffffffffffd150,
                              in_stack_ffffffffffffd148,in_stack_ffffffffffffd140,
                              in_stack_ffffffffffffd138);
        if (local_28 == (CTcSrcFile *)0x0) {
          if (local_30 == 0) {
            sVar6 = strlen((char *)&local_1038);
            log_error(0x2716,sVar6 & 0xffffffff,&local_1038);
          }
          else {
            log_error(0x2748,*(undefined8 *)(in_RDI + 0x10));
          }
        }
        else {
          pCVar8 = &local_1038;
          this_00 = (CTcTokenizer *)strlen((char *)&local_1038);
          utf8_ptr::getptr(&local_20);
          pcVar5 = utf8_ptr::getptr(&local_20);
          if (pcVar5 != (char *)0x0) {
            pcVar5 = utf8_ptr::getptr(&local_20);
            strlen(pcVar5);
          }
          local_2048 = get_file_desc(this_02,in_stack_ffffffffffffcf60,
                                     (size_t)in_stack_ffffffffffffcf58,iVar1,
                                     in_stack_ffffffffffffcf48,(size_t)in_stack_ffffffffffffcf40);
          CTcTokStream::set_newline_spacing
                    (*(CTcTokStream **)(in_RDI + 0x58),*(newline_spacing_mode_t *)(in_RDI + 4));
          this_01 = (CTcTokStream *)operator_new(0x30);
          CTcTokStream::CTcTokStream
                    (this_01,local_2048,&local_28->super_CTcSrcObject,
                     *(CTcTokStream **)(in_RDI + 0x58),local_2c,*(int *)(in_RDI + 0x338));
          *(CTcTokStream **)(in_RDI + 0x58) = this_01;
          if ((*in_RDI & 1) != 0) {
            add_include_once(this_00,(char *)pCVar8);
          }
          if ((*in_RDI >> 4 & 1) != 0) {
            CTcHostIfc::print_msg(G_hostifc,"#include %s\n",&local_1038);
          }
        }
      }
      else if ((*in_RDI >> 1 & 1) != 0) {
        sVar6 = strlen((char *)&local_1038);
        log_warning(0x2717,sVar6 & 0xffffffff,&local_1038);
      }
    }
  }
  return;
}

Assistant:

void CTcTokenizer::pp_include()
{
    wchar_t match;
    int is_local;
    int is_absolute;
    utf8_ptr fname;
    CTcSrcFile *new_src;
    int charset_error;
    int default_charset_error;
    char full_name[OSFNMAX];
    char lcl_name[OSFNMAX];
    int found;
    CTcTokFileDesc *desc;
    int expand;
    utf8_ptr start;

    /* presume we'll expand macros */
    expand = TRUE;

    /*
     *   Check to see if expansion is needed.  Macro expansion is needed
     *   only if the source line is not of one of the following forms:
     *   
     *.  #include "filename"
     *.  #include <filename> 
     */
    for (start = p_ ; is_space(p_.getch()) ; p_.inc()) ;
    switch(p_.getch())
    {
    case '<':
        /* look for a matching '>' */
        match = '>';
        goto find_match;

    case '"':
        /* look for a matching '"' */
        match = '"';
        goto find_match;

    find_match:
        /* find the matching character */
        for (p_.inc() ; p_.getch() != '\0' && p_.getch() != match ;
             p_.inc()) ;

        /* if we found it, check for other characters on the line */
        if (p_.getch() == match)
        {
            /* skip the matching character */
            p_.inc();

            /* skip whitespace */
            while (is_space(p_.getch()))
                p_.inc();

            /* 
             *   make sure there's nothing else on the line - if not, it's
             *   one of the approved formats, so there's no need to do
             *   macro expansion 
             */
            if (p_.getch() == 0)
                expand = FALSE;
        }
        break;
    }

    /* go back to read from the original starting point */
    p_ = start;
    
    /* expand macros if necessary */
    if (expand)
    {
        /* do the expansion */
        if (expand_macros_curline(FALSE, FALSE, FALSE))
        {
            /* clear the buffer and abort */
            clear_linebuf();
            return;
        }

        /* 
         *   remove any expansion flags, so that we don't have to worry about
         *   parsing or skipping them
         */
        remove_expansion_flags(&expbuf_);

        /* read from the expansion buffer */
        start_new_line(&expbuf_, 0);
    }

    /* skip leading whitespace */
    for ( ; is_space(p_.getch()) ; p_.inc()) ;

    /* we have to be looking at at '"' or '<' character */
    if (p_.getch() == '"')
    {
        /* look for a matching quote, and look for a local file */
        match = '"';
        is_local = TRUE;
    }
    else if (p_.getch() == '<')
    {
        /* look for a matching angle bracket, and look for a system file */
        match = '>';
        is_local = FALSE;
    }
    else
    {
        /* invalid syntax - log an error and ignore the line */
        log_error(TCERR_BAD_INC_SYNTAX);
        clear_linebuf();
        return;
    }

    /* skip the open quote, and remember where the filename starts */
    p_.inc();
    fname = p_;

    /* find the matching quote */
    for ( ; p_.getch() != '\0' && p_.getch() != match ; p_.inc()) ;

    /* if we didn't find the match, log an error and ignore the line */
    if (p_.getch() == '\0')
    {
        log_error(TCERR_BAD_INC_SYNTAX);
        clear_linebuf();
        return;
    }
    else
    {
        /*   
         *   We found the close quote.  Before we parse the filename, make
         *   one last check: if there's anything further on the line apart
         *   from whitespace, it's extraneous, so issue a warning.  
         */

        /* remember where the close quote is */
        utf8_ptr closep = p_;
        
        /* skip it, and then skip any trailing whitespace */
        for (p_.inc() ; is_space(p_.getch()) ; p_.inc()) ;

        /* if we're not at the end of the line, issue a warning */
        if (p_.getch() != '\0')
            log_warning(TCERR_EXTRA_INC_SYNTAX);

        /* 
         *   Null-terminate the filename.  (We know there's nothing else
         *   interesting in the buffer after the filename at this point, so
         *   we don't care about overwriting the quote or anything that might
         *   come after it.)  
         */
        closep.setch('\0');
    }

    /* check to see if the filename is absolute */
    is_absolute = os_is_file_absolute(fname.getptr());

    /* we have yet to find the file */
    found = FALSE;

    /* 
     *   in case the name is in portable URL notation, convert from URL
     *   notation to local notation; we'll consider this form of the name
     *   first, and only if we can't find it in this form will we try
     *   treating the name as using local filename conventions 
     */
    os_cvt_url_dir(lcl_name, sizeof(lcl_name), fname.getptr());

    /*
     *   Search for the included file.
     *   
     *   First, if it's a local file (in quotes rather than angle
     *   brackets), start the search in the directory containing the
     *   current file, then look in the directory containing the parent
     *   file, and so on.  If we fail to find it, proceed as for a
     *   non-local file.
     */
    if (is_local && last_desc_ != 0)
    {
        CTcTokStream *cur_str;
        char pathbuf[OSFNMAX];
        
        /* start with the current file, and search parents */
        for (cur_str = str_ ; cur_str != 0 ; cur_str = cur_str->get_parent())
        {
            /* get the path to the current file */
            os_get_path_name(pathbuf, sizeof(pathbuf),
                             last_desc_->get_fname());

            /* 
             *   try the URL-converted name first - this takes precedence
             *   over a local interpretation of the name 
             */
            os_build_full_path(full_name, sizeof(full_name),
                               pathbuf, lcl_name);
            if (!osfacc(full_name))
            {
                found = TRUE;
                break;
            }

            /* if it's a relative local name, try again with local naming */
            if (!is_absolute)
            {
                /* 
                 *   build the full filename, treating the name as using
                 *   local system conventions 
                 */
                os_build_full_path(full_name, sizeof(full_name),
                                   pathbuf, fname.getptr());
                
                /* if we found it, so note and stop searching */
                if (!osfacc(full_name))
                {
                    found = TRUE;
                    break;
                }
            }
        }
    }

    /*
     *   If we still haven't found the file (or if it's a non-local file,
     *   in angle brackets), search the include path.
     */
    if (!found)
    {
        tctok_incpath_t *inc_path;
        
        /* scan the include path */
        for (inc_path = incpath_head_ ; inc_path != 0 ;
             inc_path = inc_path->nxt)
        {
            /* try the URL-converted local name first */
            os_build_full_path(full_name, sizeof(full_name),
                               inc_path->path, lcl_name);
            if (!osfacc(full_name))
            {
                found = TRUE;
                break;
            }

            /* try with the local name, if it's a relative local name */
            if (!is_absolute)
            {
                /* build the full name for the file in this directory */
                os_build_full_path(full_name, sizeof(full_name),
                                   inc_path->path, fname.getptr());
                
                /* if we found it, stop searching */
                if (!osfacc(full_name))
                {
                    found = TRUE;
                    break;
                }
            }
        }
    }

    /* 
     *   If the filename specified an absolute path, and we didn't find a
     *   file with any of the local interpretations, look at the absolute
     *   path.  Note that our portable URL-style notation doesn't allow
     *   absolute notation, so we use only the exact name as specified in
     *   the #include directive as the absolute form.  
     */
    if (is_absolute && !found)
    {
        /* use the original filename as the full name */
        strcpy(full_name, fname.getptr());

        /* try finding the file */
        found = !osfacc(full_name);
    }

    /* 
     *   we have our copy of the filename now; we don't want to retain
     *   this directive in the preprocessed source, so clear out the line
     *   buffer now 
     */
    clear_linebuf();

    /* 
     *   if we didn't find the file anywhere, show an error and ignore the
     *   #include directive 
     */
    if (!found)
    {
        log_error(TCERR_INC_NOT_FOUND,
                  (int)strlen(fname.getptr()), fname.getptr());
        return;
    }
    
    /*
     *   Check the list of included files that are marked for inclusion
     *   only once.  If we've already included this file, ignore this
     *   redundant inclusion.  Check based on the full filename that we
     *   resolved from the search path.  
     */
    if (find_include_once(full_name))
    {
        /* log an error if appropriate */
        if (warn_on_ignore_incl_)
            log_warning(TCERR_REDUNDANT_INCLUDE,
                        (int)strlen(full_name), full_name);
        
        /* ignore this #include directive */
        return;
    }

    /* open a file source to read the file */
    new_src = CTcSrcFile::open_source(full_name, res_loader_,
                                      default_charset_, &charset_error,
                                      &default_charset_error);

    /* if we couldn't open the file, log an error and ignore the line */
    if (new_src == 0)
    {
        /* 
         *   if the error was due to the default character set, log that
         *   problem; otherwise, log the general file-open problem 
         */
        if (default_charset_error)
            log_error(TCERR_CANT_LOAD_DEFAULT_CHARSET, default_charset_);
        else
            log_error(TCERR_INC_NOT_FOUND,
                      (int)strlen(full_name), full_name);

        /* we can go no further */
        return;
    }

    /* get the descriptor for the source file */
    desc = get_file_desc(full_name, strlen(full_name), FALSE,
                         fname.getptr(),
                         fname.getptr() != 0 ? strlen(fname.getptr()) : 0);

    /* 
     *   remember the current #pragma newline_spacing mode, so we can restore
     *   it when we reinstate the current stream 
     */
    str_->set_newline_spacing(string_newline_spacing_);

    /* 
     *   Create and install the new file reader stream object.  By
     *   installing it as the current reader, we'll activate it so that
     *   the next line read will come from the new stream.  Note that the
     *   current stream becomes the parent of the new stream, so that we
     *   revert to the current stream when the new stream is exhausted;
     *   this will allow us to pick up reading from the current stream at
     *   the next line after the #include directive when we've finished
     *   including the new file.  
     */
    str_ = new CTcTokStream(desc, new_src, str_, charset_error, if_sp_);

    /*
     *   If we're in ALL_ONCE mode, it means that every single file we
     *   include should be included only once. 
     */
    if (all_once_)
        add_include_once(full_name);

    /* 
     *   if we're in list-includes mode, write the name of the include file
     *   to the standard output 
     */
    if (list_includes_mode_)
        G_hostifc->print_msg("#include %s\n", full_name);
}